

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.h
# Opt level: O2

int __thiscall QDate::day(QDate *this)

{
  YearMonthDay YVar1;
  
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    YVar1 = QGregorianCalendar::partsFromJulian(this->jd);
    if (YVar1.month != -0x80000000) {
      return YVar1.day;
    }
  }
  return 0;
}

Assistant:

constexpr bool isValid() const { return jd >= minJd() && jd <= maxJd(); }